

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLReader.cc
# Opt level: O2

void OpenMesh::IO::trimStdString(string *_string)

{
  long lVar1;
  long lVar2;
  string local_40 [32];
  
  lVar1 = std::__cxx11::string::find_first_not_of((char *)_string,0x1c3f2e);
  lVar2 = std::__cxx11::string::find_last_not_of((char *)_string,0x1c3f2e);
  if (lVar1 == -1 || lVar2 == -1) {
    std::__cxx11::string::assign((char *)_string);
    return;
  }
  std::__cxx11::string::substr((ulong)local_40,(ulong)_string);
  std::__cxx11::string::operator=((string *)_string,local_40);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void trimStdString( std::string& _string) {
  // Trim Both leading and trailing spaces

  size_t start = _string.find_first_not_of(" \t\r\n");
  size_t end   = _string.find_last_not_of(" \t\r\n");

  if(( std::string::npos == start ) || ( std::string::npos == end))
    _string = "";
  else
    _string = _string.substr( start, end-start+1 );
}